

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O0

void addEdgesFromMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  reference pbVar4;
  bool local_15a;
  string local_148 [32];
  string local_128 [39];
  byte local_101;
  string local_100 [39];
  byte local_d9;
  string local_d8 [36];
  undefined4 local_b4;
  string local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  _Self local_90;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_68 [8];
  string source;
  undefined1 local_48 [8];
  string target;
  MoveRegRegCommand *moveRegRegCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignoreList_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *graph_local;
  CodeLine *line_local;
  
  peVar3 = std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *)
                      line);
  if (peVar3 != (element_type *)0x0) {
    __dynamic_cast(peVar3,&AssemblyCode::AssemblyCommand::typeinfo,
                   &AssemblyCode::MoveRegRegCommand::typeinfo,0);
  }
  AssemblyCode::MoveRegRegCommand::getTarget_abi_cxx11_((MoveRegRegCommand *)local_48);
  AssemblyCode::MoveRegRegCommand::getSource_abi_cxx11_((MoveRegRegCommand *)local_68);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&line->liveOutTemps);
  local_90._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&line->liveOutTemps);
  while (bVar1 = std::operator!=(&__end1,&local_90), bVar1) {
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_b0,(string *)pbVar4);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_68);
    if (_Var2) {
      local_b4 = 3;
    }
    else {
      local_d9 = 0;
      local_101 = 0;
      bVar1 = isInIgnoreList((string *)local_b0);
      local_15a = false;
      if (!bVar1) {
        bVar1 = isInIgnoreList((string *)local_48);
        local_15a = false;
        if (!bVar1) {
          std::__cxx11::string::string(local_d8,local_b0);
          local_d9 = 1;
          bVar1 = isInDynamicIgnoreList((string *)local_d8,ignoreList);
          local_15a = false;
          if (!bVar1) {
            std::__cxx11::string::string(local_100,(string *)local_48);
            local_101 = 1;
            bVar1 = isInDynamicIgnoreList((string *)local_100,ignoreList);
            local_15a = false;
            if (!bVar1) {
              local_15a = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_48,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b0);
            }
          }
        }
      }
      if ((local_101 & 1) != 0) {
        std::__cxx11::string::~string(local_100);
      }
      if ((local_d9 & 1) != 0) {
        std::__cxx11::string::~string(local_d8);
      }
      if (local_15a != false) {
        std::__cxx11::string::string(local_128,(string *)local_48);
        std::__cxx11::string::string(local_148,local_b0);
        AssemblyCode::addNotOrientedEdge((string *)local_128,(string *)local_148,graph);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string(local_128);
      }
      local_b4 = 0;
    }
    std::__cxx11::string::~string(local_b0);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void addEdgesFromMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                          std::vector<std::string>& ignoreList) {
    AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
            dynamic_cast<AssemblyCode::MoveRegRegCommand*>(line.command.get());

    std::string target = moveRegRegCommand->getTarget();
    std::string source = moveRegRegCommand->getSource();

    for (auto outTemp : line.liveOutTemps) {
        if (outTemp == source) {
            continue;
        }

        if (!isInIgnoreList(outTemp) && !isInIgnoreList(target) &&
                !isInDynamicIgnoreList(outTemp, ignoreList) && !isInDynamicIgnoreList(target, ignoreList) &&
                target != outTemp) {
            AssemblyCode::addNotOrientedEdge( target, outTemp, graph );
        }
    }
}